

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_26382a::BuildSystemImpl::loadDescription
          (BuildSystemImpl *this,StringRef filename)

{
  StringRef mainFilename;
  bool bVar1;
  Twine local_90;
  StringRef local_78;
  BuildSystemImpl *local_68;
  char *local_60;
  BuildFile local_58;
  unique_ptr<llbuild::buildsystem::BuildDescription,_std::default_delete<llbuild::buildsystem::BuildDescription>_>
  local_50;
  unique_ptr<llbuild::buildsystem::BuildDescription,_std::default_delete<llbuild::buildsystem::BuildDescription>_>
  description;
  BuildSystemImpl *this_local;
  StringRef filename_local;
  
  filename_local.Data = (char *)filename.Length;
  this_local = (BuildSystemImpl *)filename.Data;
  llvm::StringRef::operator_cast_to_string((string *)&description,(StringRef *)&this_local);
  std::__cxx11::string::operator=((string *)&this->mainFilename,(string *)&description);
  std::__cxx11::string::~string((string *)&description);
  local_68 = this_local;
  local_60 = filename_local.Data;
  mainFilename.Length = (size_t)filename_local.Data;
  mainFilename.Data = (char *)this_local;
  llbuild::buildsystem::BuildFile::BuildFile
            (&local_58,mainFilename,&(this->fileDelegate).super_BuildFileDelegate);
  llbuild::buildsystem::BuildFile::load((BuildFile *)&local_50);
  llbuild::buildsystem::BuildFile::~BuildFile(&local_58);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_50);
  if (bVar1) {
    std::
    unique_ptr<llbuild::buildsystem::BuildDescription,_std::default_delete<llbuild::buildsystem::BuildDescription>_>
    ::operator=(&this->buildDescription,&local_50);
  }
  else {
    local_78 = getMainFilename(this);
    llvm::Twine::Twine(&local_90,"unable to load build file");
    error(this,local_78,&local_90);
  }
  filename_local.Length._7_1_ = bVar1;
  std::
  unique_ptr<llbuild::buildsystem::BuildDescription,_std::default_delete<llbuild::buildsystem::BuildDescription>_>
  ::~unique_ptr(&local_50);
  return (bool)(filename_local.Length._7_1_ & 1);
}

Assistant:

bool loadDescription(StringRef filename) {
    this->mainFilename = filename;

    auto description = BuildFile(filename, fileDelegate).load();
    if (!description) {
      error(getMainFilename(), "unable to load build file");
      return false;
    }

    buildDescription = std::move(description);
    return true;
  }